

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_33c573::BuildEngineImpl::cancelRemainingTasks(BuildEngineImpl *this)

{
  RuleInfo *this_00;
  bool bVar1;
  size_type sVar2;
  reference ppVar3;
  TaskInfo *pTVar4;
  reference ppVar5;
  pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo> *it_1;
  iterator __end2_1;
  iterator __begin2_1;
  unordered_map<llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo,_std::hash<llbuild::core::KeyID>,_std::equal_to<llbuild::core::KeyID>,_std::allocator<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>_>
  *__range2_1;
  RuleInfo *ruleInfo;
  TaskInfo *taskInfo;
  pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo> *it;
  iterator __end2;
  iterator __begin2;
  unordered_map<llbuild::core::Task_*,_(anonymous_namespace)::BuildEngineImpl::TaskInfo,_std::hash<llbuild::core::Task_*>,_std::equal_to<llbuild::core::Task_*>,_std::allocator<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>_>
  *__range2;
  lock_guard<std::mutex> guard;
  unique_lock<std::mutex> lock;
  BuildEngineImpl *this_local;
  
  do {
    if (this->numOutstandingUnfinishedTasks == 0) {
      std::lock_guard<std::mutex>::lock_guard
                ((lock_guard<std::mutex> *)&__range2,&this->taskInfosMutex);
      __end2 = std::
               unordered_map<llbuild::core::Task_*,_(anonymous_namespace)::BuildEngineImpl::TaskInfo,_std::hash<llbuild::core::Task_*>,_std::equal_to<llbuild::core::Task_*>,_std::allocator<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>_>
               ::begin(&this->taskInfos);
      it = (pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo> *)
           std::
           unordered_map<llbuild::core::Task_*,_(anonymous_namespace)::BuildEngineImpl::TaskInfo,_std::hash<llbuild::core::Task_*>,_std::equal_to<llbuild::core::Task_*>,_std::allocator<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>_>
           ::end(&this->taskInfos);
      while( true ) {
        bVar1 = std::__detail::operator!=
                          (&__end2.
                            super__Node_iterator_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
                           ,(_Node_iterator_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
                             *)&it);
        if (!bVar1) {
          __end2_1 = std::
                     unordered_map<llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo,_std::hash<llbuild::core::KeyID>,_std::equal_to<llbuild::core::KeyID>,_std::allocator<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>_>
                     ::begin(&this->ruleInfos);
          it_1 = (pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>
                  *)std::
                    unordered_map<llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo,_std::hash<llbuild::core::KeyID>,_std::equal_to<llbuild::core::KeyID>,_std::allocator<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>_>
                    ::end(&this->ruleInfos);
          while (bVar1 = std::__detail::operator!=
                                   (&__end2_1.
                                     super__Node_iterator_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
                                    ,(_Node_iterator_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
                                      *)&it_1), bVar1) {
            ppVar5 = std::__detail::
                     _Node_iterator<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_false,_true>
                     ::operator*(&__end2_1);
            bVar1 = RuleInfo::isScanning(&ppVar5->second);
            if (bVar1) {
              RuleInfo::setCancelled(&ppVar5->second);
            }
            std::__detail::
            _Node_iterator<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_false,_true>
            ::operator++(&__end2_1);
          }
          std::
          vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
          ::clear(&this->ruleInfosToScan);
          std::
          deque<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
          ::clear(&this->inputRequests);
          std::
          vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
          ::clear(&this->finishedInputRequests);
          std::
          deque<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
          ::clear(&this->readyTaskInfos);
          std::
          vector<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
          ::clear(&this->finishedTaskInfos);
          std::
          unordered_map<llbuild::core::Task_*,_(anonymous_namespace)::BuildEngineImpl::TaskInfo,_std::hash<llbuild::core::Task_*>,_std::equal_to<llbuild::core::Task_*>,_std::allocator<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>_>
          ::clear(&this->taskInfos);
          std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&__range2);
          return;
        }
        ppVar3 = std::__detail::
                 _Node_iterator<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false,_false>
                 ::operator*(&__end2);
        this_00 = (ppVar3->second).forRuleInfo;
        pTVar4 = RuleInfo::getPendingTaskInfo(this_00);
        if (&ppVar3->second != pTVar4) break;
        RuleInfo::setPendingTaskInfo(this_00,(TaskInfo *)0x0);
        RuleInfo::setCancelled(this_00);
        std::__detail::
        _Node_iterator<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false,_false>
        ::operator++(&__end2);
      }
      __assert_fail("taskInfo == ruleInfo->getPendingTaskInfo()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                    ,0x553,"void (anonymous namespace)::BuildEngineImpl::cancelRemainingTasks()");
    }
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)&guard,&this->finishedTaskInfosMutex);
    bVar1 = std::
            vector<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
            ::empty(&this->finishedTaskInfos);
    if (bVar1) {
      std::condition_variable::wait((unique_lock *)&this->finishedTaskInfosCondition);
    }
    else {
      sVar2 = std::
              vector<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
              ::size(&this->finishedTaskInfos);
      if (this->numOutstandingUnfinishedTasks < sVar2) {
        __assert_fail("finishedTaskInfos.size() <= numOutstandingUnfinishedTasks",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                      ,0x53b,"void (anonymous namespace)::BuildEngineImpl::cancelRemainingTasks()");
      }
      sVar2 = std::
              vector<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
              ::size(&this->finishedTaskInfos);
      this->numOutstandingUnfinishedTasks = this->numOutstandingUnfinishedTasks - (int)sVar2;
      std::
      vector<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
      ::clear(&this->finishedTaskInfos);
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&guard);
  } while( true );
}

Assistant:

void cancelRemainingTasks() {
    // We need to wait for any currently running tasks to be reported as
    // complete. Not doing this would mean we could get asynchronous calls
    // attempting to modify the task state concurrently with the cancellation
    // process, which isn't something we want to need to synchronize on.
    //
    // We don't process the requests at all, we simply drain them. In practice,
    // we expect clients to implement cancellation in conjection with causing
    // long-running tasks to also cancel and fail, so preserving those results
    // is not valuable.
    while (numOutstandingUnfinishedTasks != 0) {
        std::unique_lock<std::mutex> lock(finishedTaskInfosMutex);
        if (finishedTaskInfos.empty()) {
          finishedTaskInfosCondition.wait(lock);
        } else {
          assert(finishedTaskInfos.size() <= numOutstandingUnfinishedTasks);
          numOutstandingUnfinishedTasks -= finishedTaskInfos.size();
          finishedTaskInfos.clear();
        }
    }

    std::lock_guard<std::mutex> guard(taskInfosMutex);

    for (auto& it: taskInfos) {
      // Cancel the task, marking it incomplete.
      //
      // This will force it to rerun in a later build, but since it was already
      // running in this build that was almost certainly going to be
      // required. Technically, there are rare situations where it wouldn't have
      // to rerun (e.g., if resultIsValid becomes true after being false in this
      // run), and if we were willing to restore the tasks state--either by
      // keeping the old one or by restoring from the database--we could ensure
      // that doesn't happen.
      //
      // NOTE: Actually, we currently don't sync this write to the database, so
      // in some cases we do actually preserve this information (if the client
      // ends up cancelling, then reloading froom the database).
      TaskInfo* taskInfo = &it.second;
      RuleInfo* ruleInfo = taskInfo->forRuleInfo;
      assert(taskInfo == ruleInfo->getPendingTaskInfo());
      ruleInfo->setPendingTaskInfo(nullptr);
      ruleInfo->setCancelled();
    }

    // FIXME: This is currently an O(n) operation that could be relatively
    // expensive on larger projects.  We should be able to do something more
    // targeted. rdar://problem/39386591
    for (auto& it: ruleInfos) {
      // Cancel outstanding activity on rules
      if (it.second.isScanning()) {
        it.second.setCancelled();
      }
    }

    // Delete all of the tasks.
    ruleInfosToScan.clear();
    inputRequests.clear();
    finishedInputRequests.clear();
    readyTaskInfos.clear();
    finishedTaskInfos.clear();
    taskInfos.clear();
  }